

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

token * __thiscall
tinyusdz::AttrMetas::get_colorSpace(token *__return_storage_ptr__,AttrMetas *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  undefined1 local_68 [8];
  token tok;
  key_type_conflict local_40;
  MetaVariable *local_20;
  MetaVariable *mv;
  AttrMetas *this_local;
  
  mv = (MetaVariable *)this;
  this_local = (AttrMetas *)__return_storage_ptr__;
  bVar1 = has_colorSpace(this);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_40,"colorSpace",(allocator *)(tok.str_.field_2._M_local_buf + 0xf));
    pmVar2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
             ::at(&this->meta,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::allocator<char>::~allocator((allocator<char> *)(tok.str_.field_2._M_local_buf + 0xf));
    local_20 = pmVar2;
    Token::Token((Token *)local_68);
    bVar1 = MetaVariable::get_value<tinyusdz::Token>(local_20,(Token *)local_68);
    if (bVar1) {
      Token::Token(__return_storage_ptr__,(Token *)local_68);
    }
    else {
      Token::Token(__return_storage_ptr__);
    }
    Token::~Token((Token *)local_68);
  }
  else {
    Token::Token(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

value::token AttrMetas::get_colorSpace() const {
  if (!has_colorSpace()) {
    return value::token();
  }

  const MetaVariable &mv = meta.at("colorSpace");
  value::token tok;
  if (mv.get_value<value::token>(&tok)) {
    return tok;
  }

  return value::token();
}